

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuizmo.cpp
# Opt level: O0

vec_t ImGuizmo::Cross(vec_t *v1,vec_t *v2)

{
  vec_t vVar1;
  vec_t *v2_local;
  vec_t *v1_local;
  vec_t res;
  
  vVar1.y = v1->z * v2->x - v1->x * v2->z;
  vVar1.x = v1->y * v2->z - v1->z * v2->y;
  vVar1.z = v1->x * v2->y - v1->y * v2->x;
  vVar1.w = 0.0;
  return vVar1;
}

Assistant:

vec_t Cross(const vec_t& v1, const vec_t& v2)
   {
      vec_t res;
      res.x = v1.y * v2.z - v1.z * v2.y;
      res.y = v1.z * v2.x - v1.x * v2.z;
      res.z = v1.x * v2.y - v1.y * v2.x;
      res.w = 0.f;
      return res;
   }